

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void normalize_suite::run(void)

{
  normalize_even();
  normalize_odd();
  normalize_increasing();
  normalize_decreasing();
  normalize_one();
  normalize_two();
  normalize_three();
  return;
}

Assistant:

void run()
{
    normalize_even();
    normalize_odd();
    normalize_increasing();
    normalize_decreasing();
    normalize_one();
    normalize_two();
    normalize_three();
}